

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O2

void print_socket_error(void)

{
  int *piVar1;
  char *pcVar2;
  ostream *poVar3;
  
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void print_socket_error()
{
	using namespace std;

#ifdef _WIN32
	LPSTR msg = nullptr;
	FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM,
	              0, WSAGetLastError(), 0, (LPSTR)&msg, 0, 0);
	cout << msg << endl;
	LocalFree(msg);
#else
	cout << strerror(errno) << endl;
#endif
}